

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.c
# Opt level: O0

int evfilt_proc_knote_delete(filter *filt,knote *kn)

{
  int iVar1;
  long in_RSI;
  int rv;
  uint in_stack_ffffffffffffffe8;
  int iVar2;
  
  iVar2 = 0;
  if ((*(ushort *)(in_RSI + 10) & 8) == 0) {
    iVar1 = evfilt_proc_knote_disable((filter *)(ulong)in_stack_ffffffffffffffe8,(knote *)0x10c9d6);
    if (iVar1 < 0) {
      iVar2 = -1;
    }
  }
  iVar1 = close(*(int *)(in_RSI + 0x80));
  if (iVar1 < 0) {
    iVar2 = -1;
  }
  *(undefined4 *)(in_RSI + 0x80) = 0xffffffff;
  return iVar2;
}

Assistant:

int
evfilt_proc_knote_delete(struct filter *filt, struct knote *kn)
{
    int rv = 0;

    /* If it's enabled, we need to remove the pidfd from epoll */
    if (KNOTE_ENABLED(kn) && (evfilt_proc_knote_disable(filt, kn) < 0)) rv = -1;

    dbg_printf("closed pidfd=%i", kn->kn_procfd);
    if (close(kn->kn_procfd) < 0) rv = -1;
    kn->kn_procfd = -1;

    return (rv);
}